

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O3

void __thiscall
slang::SmallVectorBase<slang::SourceBuffer>::reallocateTo
          (SmallVectorBase<slang::SourceBuffer> *this,size_type newCapacity)

{
  undefined8 *puVar1;
  undefined8 *puVar2;
  size_type sVar3;
  undefined8 uVar4;
  pointer pSVar5;
  long lVar6;
  pointer __ptr;
  
  pSVar5 = (pointer)detail::allocArray(newCapacity,0x18);
  __ptr = this->data_;
  sVar3 = this->len;
  if (sVar3 != 0) {
    lVar6 = 0;
    do {
      *(undefined8 *)((long)&(pSVar5->id).id + lVar6) =
           *(undefined8 *)((long)&(__ptr->id).id + lVar6);
      puVar1 = (undefined8 *)((long)&(__ptr->data)._M_len + lVar6);
      uVar4 = puVar1[1];
      puVar2 = (undefined8 *)((long)&(pSVar5->data)._M_len + lVar6);
      *puVar2 = *puVar1;
      puVar2[1] = uVar4;
      lVar6 = lVar6 + 0x18;
    } while (sVar3 * 0x18 != lVar6);
    __ptr = this->data_;
  }
  if (__ptr != (pointer)this->firstElement) {
    free(__ptr);
  }
  this->cap = newCapacity;
  this->data_ = pSVar5;
  return;
}

Assistant:

void reallocateTo(size_type newCapacity) {
        auto newData = (pointer)detail::allocArray(newCapacity, sizeof(T));
        std::uninitialized_move(begin(), end(), newData);

        cleanup();
        cap = newCapacity;
        data_ = newData;
    }